

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

int NULLC::StrEqual(NULLCArray a,NULLCArray b)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  
  uVar4 = a.len;
  uVar3 = 0;
  if (uVar4 == b.len) {
    bVar6 = uVar4 == 0;
    if ((!bVar6) && (*a.ptr == *b.ptr)) {
      lVar5 = 1;
      do {
        uVar3 = (uint)lVar5;
        if (uVar4 == uVar3) break;
        pcVar1 = a.ptr + lVar5;
        pcVar2 = b.ptr + lVar5;
        lVar5 = lVar5 + 1;
      } while (*pcVar1 == *pcVar2);
      bVar6 = uVar4 <= uVar3;
    }
    uVar3 = (uint)bVar6;
  }
  return uVar3;
}

Assistant:

int NULLC::StrEqual(NULLCArray a, NULLCArray b)
{
	if(a.len != b.len)
		return 0;
	for(unsigned int i = 0; i < a.len; i++)
		if(a.ptr[i] != b.ptr[i])
			return 0;
	return 1;
}